

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

AutoFile * __thiscall
AutoFile::operator>>
          (AutoFile *this,
          Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
          *obj)

{
  long lVar1;
  iterator __position;
  uint64_t uVar2;
  vector<double,_std::allocator<double>_> *extraout_RDX;
  vector<double,_std::allocator<double>_> *v;
  vector<double,_std::allocator<double>_> *extraout_RDX_00;
  vector<double,_std::allocator<double>_> *extraout_RDX_01;
  ulong uVar3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar4;
  uint64_t __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_erase_at_end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)obj,(pointer)obj->m_object);
  uVar2 = ReadCompactSize<AutoFile>(this,true);
  if (uVar2 != 0) {
    __n = 0;
    do {
      uVar3 = __n + 0x32dcd;
      __n = uVar2;
      if (uVar3 < uVar2) {
        __n = uVar3;
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::reserve((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)obj,__n);
      v = extraout_RDX;
      while (__position._M_current = (vector<double,_std::allocator<double>_> *)obj[1].m_object,
            (ulong)(((long)__position._M_current - (long)obj->m_object >> 3) * -0x5555555555555555)
            < __n) {
        if (__position._M_current == (vector<double,_std::allocator<double>_> *)obj[2].m_object) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::_M_realloc_insert<>
                    ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)obj,__position);
          pvVar4 = obj[1].m_object;
          v = extraout_RDX_00;
        }
        else {
          ((__position._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvVar4 = obj[1].m_object + 1;
          obj[1].m_object = pvVar4;
        }
        VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
        Unser<AutoFile,std::vector<double,std::allocator<double>>>
                  ((VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *)this,
                   (AutoFile *)(pvVar4 + -1),v);
        v = extraout_RDX_01;
      }
    } while (uVar3 < uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile& operator>>(T&& obj)
    {
        ::Unserialize(*this, obj);
        return *this;
    }